

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O1

int write_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  nal_t *pnVar2;
  uint uVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  if ((b->bits_left == 8) && (b->p < b->end)) {
    *b->p = '\x01';
    b->p = b->p + 1;
  }
  else {
    iVar5 = 7;
    do {
      iVar6 = b->bits_left + -1;
      b->bits_left = iVar6;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
        *b->p = *b->p | (byte)((1U >> ((byte)iVar5 & 0x1f)) << ((byte)b->bits_left & 0x1f));
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      bVar10 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while (bVar10);
  }
  uVar3 = avcc->AVCProfileIndication;
  if ((b->bits_left == 8) && (b->p < b->end)) {
    *b->p = (uint8_t)uVar3;
    b->p = b->p + 1;
  }
  else {
    uVar7 = 7;
    do {
      iVar5 = b->bits_left + -1;
      b->bits_left = iVar5;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
        *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      bVar10 = uVar7 != 0;
      uVar7 = uVar7 - 1;
    } while (bVar10);
  }
  uVar3 = avcc->profile_compatibility;
  if ((b->bits_left == 8) && (b->p < b->end)) {
    *b->p = (uint8_t)uVar3;
    b->p = b->p + 1;
  }
  else {
    uVar7 = 7;
    do {
      iVar5 = b->bits_left + -1;
      b->bits_left = iVar5;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
        *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      bVar10 = uVar7 != 0;
      uVar7 = uVar7 - 1;
    } while (bVar10);
  }
  uVar3 = avcc->AVCLevelIndication;
  if ((b->bits_left == 8) && (b->p < b->end)) {
    *b->p = (uint8_t)uVar3;
    b->p = b->p + 1;
  }
  else {
    uVar7 = 7;
    do {
      iVar5 = b->bits_left + -1;
      b->bits_left = iVar5;
      pbVar1 = b->p;
      if (pbVar1 < b->end) {
        *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
        *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
      }
      if (b->bits_left == 0) {
        b->p = b->p + 1;
        b->bits_left = 8;
      }
      bVar10 = uVar7 != 0;
      uVar7 = uVar7 - 1;
    } while (bVar10);
  }
  uVar3 = 5;
  do {
    iVar5 = b->bits_left + -1;
    b->bits_left = iVar5;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
      *b->p = *b->p | ((0x3fU >> (uVar3 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar10 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar10);
  uVar3 = avcc->lengthSizeMinusOne;
  uVar7 = 1;
  do {
    iVar5 = b->bits_left + -1;
    b->bits_left = iVar5;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
      *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar10 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar10);
  uVar3 = 2;
  do {
    iVar5 = b->bits_left + -1;
    b->bits_left = iVar5;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
      *b->p = *b->p | ((7U >> (uVar3 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar10 = uVar3 != 0;
    uVar3 = uVar3 - 1;
  } while (bVar10);
  uVar3 = avcc->numOfSequenceParameterSets;
  uVar7 = 4;
  do {
    iVar5 = b->bits_left + -1;
    b->bits_left = iVar5;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
      *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar10 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar10);
  if (0 < avcc->numOfSequenceParameterSets) {
    lVar9 = 0;
    do {
      puVar4 = (uint8_t *)malloc(0x400);
      pnVar2 = h->nal;
      pnVar2->nal_ref_idc = 3;
      pnVar2->nal_unit_type = 7;
      h->sps = avcc->sps_table[lVar9];
      uVar3 = write_nal_unit(h,puVar4,0x400);
      if (-1 < (int)uVar3) {
        uVar7 = 0xf;
        do {
          iVar5 = b->bits_left + -1;
          b->bits_left = iVar5;
          pbVar1 = b->p;
          if (pbVar1 < b->end) {
            *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
            *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          }
          if (b->bits_left == 0) {
            b->p = b->p + 1;
            b->bits_left = 8;
          }
          bVar10 = uVar7 != 0;
          uVar7 = uVar7 - 1;
        } while (bVar10);
        lVar8 = (long)b->end - (long)b->p;
        uVar7 = (uint)lVar8;
        if ((long)(ulong)uVar3 <= lVar8) {
          uVar7 = uVar3;
        }
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        memcpy(b->p,puVar4,(ulong)uVar7);
        b->p = b->p + uVar3;
      }
      free(puVar4);
      lVar9 = lVar9 + 1;
    } while (lVar9 < avcc->numOfSequenceParameterSets);
  }
  uVar3 = avcc->numOfPictureParameterSets;
  uVar7 = 7;
  do {
    iVar5 = b->bits_left + -1;
    b->bits_left = iVar5;
    pbVar1 = b->p;
    if (pbVar1 < b->end) {
      *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
      *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar10 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar10);
  if (0 < avcc->numOfPictureParameterSets) {
    lVar9 = 0;
    do {
      puVar4 = (uint8_t *)malloc(0x400);
      pnVar2 = h->nal;
      pnVar2->nal_ref_idc = 3;
      pnVar2->nal_unit_type = 8;
      h->pps = avcc->pps_table[lVar9];
      uVar3 = write_nal_unit(h,puVar4,0x400);
      if (-1 < (int)uVar3) {
        uVar7 = 0xf;
        do {
          iVar5 = b->bits_left + -1;
          b->bits_left = iVar5;
          pbVar1 = b->p;
          if (pbVar1 < b->end) {
            *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)iVar5 & 0x1f));
            *b->p = *b->p | ((uVar3 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
          }
          if (b->bits_left == 0) {
            b->p = b->p + 1;
            b->bits_left = 8;
          }
          bVar10 = uVar7 != 0;
          uVar7 = uVar7 - 1;
        } while (bVar10);
        lVar8 = (long)b->end - (long)b->p;
        uVar7 = (uint)lVar8;
        if ((long)(ulong)uVar3 <= lVar8) {
          uVar7 = uVar3;
        }
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        memcpy(b->p,puVar4,(ulong)uVar7);
        b->p = b->p + uVar3;
      }
      free(puVar4);
      lVar9 = lVar9 + 1;
    } while (lVar9 < avcc->numOfPictureParameterSets);
  }
  iVar5 = -1;
  if (b->p <= b->end) {
    iVar5 = (int)b->p - *(int *)&b->start;
  }
  return iVar5;
}

Assistant:

int write_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    bs_write_u8(b, 1); // configurationVersion = 1;
    bs_write_u8(b, avcc->AVCProfileIndication);
    bs_write_u8(b, avcc->profile_compatibility);
    bs_write_u8(b, avcc->AVCLevelIndication);
    bs_write_u(b, 6, 0x3F); // reserved = '111111'b;
    bs_write_u(b, 2, avcc->lengthSizeMinusOne);
    bs_write_u(b, 3, 0x07); // reserved = '111'b;

    bs_write_u(b, 5, avcc->numOfSequenceParameterSets);
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_SPS;
        h->sps = avcc->sps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int sequenceParameterSetLength = len;
        bs_write_u(b, 16, sequenceParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    bs_write_u(b, 8, avcc->numOfPictureParameterSets);
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_PPS;
        h->pps = avcc->pps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int pictureParameterSetLength = len;
        bs_write_u(b, 16, pictureParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}